

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

void __thiscall anurbs::RTree<3L>::finish(RTree<3L> *this,bool hilbert_sort)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Scalar SVar5;
  pointer pMVar6;
  pointer plVar7;
  Scalar *pSVar8;
  CoeffReturnType pdVar9;
  Scalar *pSVar10;
  size_t sVar11;
  long lVar12;
  runtime_error *this_00;
  ulong uVar13;
  long lVar14;
  Index j_1;
  long lVar15;
  long index;
  Index j;
  long lVar16;
  long local_120;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hilbert_values;
  VectorU center;
  Vector box_max;
  Vector box_min;
  VectorU local_68;
  Vector size;
  
  if (this->m_nb_items < this->m_position) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"More items then expected");
  }
  else {
    if (this->m_nb_items <= this->m_position) {
      hilbert_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&this->m_max;
      hilbert_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&this->m_min;
      Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
      PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,1,3,1,1,3>const,Eigen::Matrix<double,1,3,1,1,3>const>>
                ((PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *)&size,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                  *)&hilbert_values);
      if (hilbert_sort) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                  (&hilbert_values,this->m_nb_items,(allocator_type *)&box_min);
        lVar14 = 0;
        while( true ) {
          if (this->m_nb_items <= lVar14) break;
          pMVar6 = (this->m_boxes_min).
                   super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[2] = *(double *)
                      ((long)&pMVar6[lVar14].
                              super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                              .m_data + 0x10);
          pMVar6 = pMVar6 + lVar14;
          box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[0] = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                     m_storage.m_data.array[0];
          box_min.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[1] = *(double *)
                      ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>)
                              .m_storage.m_data + 8);
          pMVar6 = (this->m_boxes_max).
                   super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[2] = *(double *)
                      ((long)&pMVar6[lVar14].
                              super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage
                              .m_data + 0x10);
          pMVar6 = pMVar6 + lVar14;
          box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[0] = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                     m_storage.m_data.array[0];
          box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
          array[1] = *(double *)
                      ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>)
                              .m_storage.m_data + 8);
          for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&box_min
                                ,lVar16);
            dVar1 = *pSVar8;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&box_max
                                ,lVar16);
            dVar2 = *pSVar8;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                &this->m_min,lVar16);
            dVar3 = *pSVar8;
            pdVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_0> *)&size,
                                lVar16);
            dVar4 = *pdVar9;
            pSVar10 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1>::
                      operator[]((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>,_1> *)
                                 &center,lVar16);
            dVar1 = (((dVar1 + dVar2) * 0.5 - dVar3) / dVar4) * 2097152.0;
            uVar13 = (ulong)dVar1;
            *pSVar10 = (long)(dVar1 - 9.223372036854776e+18) & (long)uVar13 >> 0x3f | uVar13;
          }
          local_68.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
          m_data.array[2] =
               center.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[2];
          local_68.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
          m_data.array[0] =
               center.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[0];
          local_68.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
          m_data.array[1] =
               center.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
               m_data.array[1];
          sVar11 = HilbertCurve<3L>::index_at(&local_68);
          hilbert_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14] = sVar11;
          lVar14 = lVar14 + 1;
        }
        sort(this,&hilbert_values,0,this->m_nb_items + -1);
        std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                  (&hilbert_values.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                  );
      }
      local_120 = 0;
      for (lVar14 = 0;
          plVar7 = (this->m_level_bounds).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start,
          lVar14 < ((long)(this->m_level_bounds).super__Vector_base<long,_std::allocator<long>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)plVar7 >> 3) + -1;
          lVar14 = lVar14 + 1) {
        lVar16 = plVar7[lVar14];
        while (local_120 < lVar16) {
          for (lVar15 = 0; lVar15 != 3; lVar15 = lVar15 + 1) {
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                &hilbert_values,lVar15);
            *pSVar8 = INFINITY;
            pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                               ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)&box_min
                                ,lVar15);
            *pSVar8 = -INFINITY;
          }
          lVar12 = 0;
          for (lVar15 = local_120; (lVar12 < this->m_node_size && (lVar15 < lVar16));
              lVar15 = lVar15 + 1) {
            pMVar6 = (this->m_boxes_min).
                     super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[2] = *(double *)
                        ((long)&pMVar6[lVar15].
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.
                                m_storage.m_data + 0x10);
            pMVar6 = pMVar6 + lVar15;
            box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[0] = (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                       m_storage.m_data.array[0];
            box_max.super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.m_data.
            array[1] = *(double *)
                        ((long)&(pMVar6->
                                super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                                m_storage.m_data + 8);
            pMVar6 = (this->m_boxes_max).
                     super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            center.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[2] =
                 *(unsigned_long *)
                  ((long)&pMVar6[lVar15].
                          super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>.m_storage.
                          m_data + 0x10);
            pMVar6 = pMVar6 + lVar15;
            center.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[0] =
                 *(unsigned_long *)
                  &(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).m_storage.
                   m_data;
            center.super_PlainObjectBase<Eigen::Matrix<unsigned_long,_1,_3,_1,_1,_3>_>.m_storage.
            m_data.array[1] =
                 *(unsigned_long *)
                  ((long)&(pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>).
                          m_storage.m_data + 8);
            for (index = 0; index != 3; index = index + 1) {
              pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                  &box_max,index);
              dVar1 = *pSVar8;
              pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                  &hilbert_values,index);
              if (dVar1 < *pSVar8) {
                pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                    &box_max,index);
                SVar5 = *pSVar8;
                pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                    &hilbert_values,index);
                *pSVar8 = SVar5;
              }
              pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                  &center,index);
              dVar1 = *pSVar8;
              pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                 ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                  &box_min,index);
              if (*pSVar8 <= dVar1 && dVar1 != *pSVar8) {
                pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                    &center,index);
                SVar5 = *pSVar8;
                pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1>::operator[]
                                   ((DenseCoeffsBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1> *)
                                    &box_min,index);
                *pSVar8 = SVar5;
              }
            }
            lVar12 = lVar12 + 1;
          }
          (this->m_indices).super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_start[this->m_position] = local_120;
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
                    ((this->m_boxes_min).
                     super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->m_position,
                     (Matrix<double,_1,_3,_1,_1,_3> *)&hilbert_values);
          Eigen::internal::
          call_assignment<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,1,3,1,1,3>>
                    ((this->m_boxes_max).
                     super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + this->m_position,
                     (Matrix<double,_1,_3,_1,_1,_3> *)&box_min);
          this->m_position = this->m_position + 1;
          local_120 = lVar15;
        }
      }
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Less items then expected");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void finish(const bool hilbert_sort)
    {
        if (m_position > m_nb_items) {
            throw std::runtime_error("More items then expected");
        }
        if (m_position < m_nb_items) {
            throw std::runtime_error("Less items then expected");
        }

        const Vector size = m_max - m_min;

        if (hilbert_sort) {
        std::vector<size_t> hilbert_values(m_nb_items);

        for (Index i = 0; i < m_nb_items; i++) {
            Vector box_min = m_boxes_min[i];
            Vector box_max = m_boxes_max[i];

            VectorU center;

            for (Index j = 0; j < dimension(); j++) {
                center[j] = ((box_min[j] + box_max[j]) / 2 - m_min[j]) / size[j] * HilbertCurve<TDimension>::max_axis_size();
            }

            hilbert_values[i] = HilbertCurve<TDimension>::index_at(center);
        }

        sort(hilbert_values, 0, m_nb_items - 1);
        }

        Index pos = 0;

        for (Index i = 0; i < length(m_level_bounds) - 1; i++) {
            Index end = m_level_bounds[i];

            while (pos < end) {
                Vector node_min;
                Vector node_max;

                for (Index j = 0; j < TDimension; j++) {
                    node_min[j] = Infinity;
                    node_max[j] = -Infinity;
                }

                Index node_index = pos;

                for (Index j = 0; j < m_node_size && pos < end; j++) {
                    Vector box_min = m_boxes_min[pos];
                    Vector box_max = m_boxes_max[pos];

                    pos += 1;

                    for (Index k = 0; k < dimension(); k++) {
                        if (box_min[k] < node_min[k]) {
                            node_min[k] = box_min[k];
                        }
                        if (box_max[k] > node_max[k]) {
                            node_max[k] = box_max[k];
                        }
                    }
                }

                m_indices[m_position] = node_index;
                m_boxes_min[m_position] = node_min;
                m_boxes_max[m_position] = node_max;

                m_position += 1;
            }
        }
    }